

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alp.hpp
# Opt level: O0

uint64_t duckdb::alp::AlpCompression<double,_true>::DryCompressToEstimateSize<false>
                   (vector<double,_true> *input_vector,AlpEncodingIndices encoding_indices)

{
  bool bVar1;
  uint uVar2;
  reference pdVar3;
  int64_t encoded_value_00;
  double val;
  AlpEncodingIndices in_SI;
  vector<double,_std::allocator<double>_> *in_RDI;
  __type_conflict8 __x;
  uint64_t delta;
  double decoded_value;
  int64_t encoded_value;
  double *value;
  const_iterator __end0;
  const_iterator __begin0;
  vector<double,_true> *__range3;
  int64_t min_encoded_value;
  int64_t max_encoded_value;
  uint64_t estimated_compression_size;
  uint32_t estimated_bits_per_value;
  idx_t non_exceptions_count;
  idx_t exceptions_count;
  idx_t n_values;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff68;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
  *in_stack_ffffffffffffff70;
  undefined6 in_stack_ffffffffffffff78;
  AlpEncodingIndices in_stack_ffffffffffffff7e;
  double in_stack_ffffffffffffff80;
  AlpEncodingIndices encoding_indices_00;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_58;
  vector<double,_std::allocator<double>_> *local_50;
  long local_48;
  long local_40;
  long local_38;
  undefined4 local_2c;
  long local_28;
  long local_20;
  size_type local_18;
  vector<double,_std::allocator<double>_> *local_10;
  AlpEncodingIndices local_2;
  
  local_10 = in_RDI;
  local_2 = in_SI;
  local_18 = ::std::vector<double,_std::allocator<double>_>::size(in_RDI);
  local_20 = 0;
  local_28 = 0;
  local_2c = 0;
  local_38 = 0;
  local_40 = NumericLimits<long>::Minimum();
  local_48 = NumericLimits<long>::Maximum();
  local_50 = local_10;
  local_58._M_current =
       (double *)::std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff68);
  ::std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff68);
  while( true ) {
    encoding_indices_00 = SUB82((ulong)in_stack_ffffffffffffff80 >> 0x30,0);
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffff70,
                       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                        *)in_stack_ffffffffffffff68);
    if (!bVar1) break;
    pdVar3 = __gnu_cxx::
             __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&local_58);
    encoded_value_00 =
         EncodeValue((double)CONCAT26(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff78),
                     encoding_indices_00);
    in_stack_ffffffffffffff7e = local_2;
    in_stack_ffffffffffffff80 = DecodeValue(encoded_value_00,local_2);
    if ((in_stack_ffffffffffffff80 != *pdVar3) || (NAN(in_stack_ffffffffffffff80) || NAN(*pdVar3)))
    {
      local_20 = local_20 + 1;
    }
    else {
      local_28 = local_28 + 1;
      local_40 = MaxValue<long>(encoded_value_00,local_40);
      local_48 = MinValue<long>(encoded_value_00,local_48);
    }
    __gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&local_58);
  }
  val = (double)(local_40 - local_48);
  __x = ::std::log2<unsigned_long>(0xa009a4);
  ceil(__x);
  uVar2 = ExactNumericCast<unsigned_int>(val);
  return local_20 * 0x50 + local_18 * uVar2 + local_38;
}

Assistant:

static uint64_t DryCompressToEstimateSize(const vector<T> &input_vector, AlpEncodingIndices encoding_indices) {
		idx_t n_values = input_vector.size();
		idx_t exceptions_count = 0;
		idx_t non_exceptions_count = 0;
		uint32_t estimated_bits_per_value = 0;
		uint64_t estimated_compression_size = 0;
		int64_t max_encoded_value = NumericLimits<int64_t>::Minimum();
		int64_t min_encoded_value = NumericLimits<int64_t>::Maximum();

		for (const T &value : input_vector) {
			int64_t encoded_value = EncodeValue(value, encoding_indices);
			T decoded_value = DecodeValue(encoded_value, encoding_indices);
			if (decoded_value == value) {
				non_exceptions_count++;
				max_encoded_value = MaxValue(encoded_value, max_encoded_value);
				min_encoded_value = MinValue(encoded_value, min_encoded_value);
				continue;
			}
			exceptions_count++;
		}

		// We penalize combinations which yields to almost all exceptions
		if (PENALIZE_EXCEPTIONS && non_exceptions_count < 2) {
			return NumericLimits<uint64_t>::Maximum();
		}

		// Evaluate factor/exponent compression size (we optimize for FOR)
		uint64_t delta = (static_cast<uint64_t>(max_encoded_value) - static_cast<uint64_t>(min_encoded_value));
		estimated_bits_per_value = ExactNumericCast<uint32_t>(std::ceil(std::log2(delta + 1)));
		estimated_compression_size += n_values * estimated_bits_per_value;
		estimated_compression_size +=
		    exceptions_count * (EXACT_TYPE_BITSIZE + (AlpConstants::EXCEPTION_POSITION_SIZE * 8));
		return estimated_compression_size;
	}